

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<SAT::SATLiteral>::loadFromIterator<Lib::Stack<SAT::SATLiteral>::BottomFirstIterator>
          (Stack<SAT::SATLiteral> *this,BottomFirstIterator it)

{
  anon_union_4_2_6ac8864f_for_SATLiteral_0 aVar1;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 *paVar2;
  
  for (paVar2 = &(it._pointer)->field_0; paVar2 != &(it._afterLast)->field_0; paVar2 = paVar2 + 1) {
    aVar1 = *paVar2;
    if (this->_cursor == this->_end) {
      expand(this);
    }
    this->_cursor->field_0 = aVar1;
    this->_cursor = this->_cursor + 1;
  }
  return;
}

Assistant:

inline
    bool hasNext() const
    {
      ASS_LE(_pointer, _afterLast);
      return _pointer != _afterLast;
    }